

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef
CompileLlvmVariableDefinitions(LlvmCompilationContext *ctx,ExprVariableDefinitions *node)

{
  LLVMValueRef pLVar1;
  ExprBase *local_20;
  ExprBase *value;
  ExprVariableDefinitions *node_local;
  LlvmCompilationContext *ctx_local;
  
  for (local_20 = (node->definitions).head; local_20 != (ExprBase *)0x0; local_20 = local_20->next)
  {
    CompileLlvm(ctx,local_20);
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmVariableDefinitions(LlvmCompilationContext &ctx, ExprVariableDefinitions *node)
{
	for(ExprBase *value = node->definitions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	return CheckType(ctx, node, NULL);
}